

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkleblock.h
# Opt level: O2

void CPartialMerkleTree::SerializationOps<VectorWriter,CPartialMerkleTree_const,ActionSerialize>
               (CPartialMerkleTree *obj,VectorWriter *s)

{
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  anon_class_8_1_a7b7af8b local_40;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  SerializeMany<VectorWriter,unsigned_int,std::vector<uint256,std::allocator<uint256>>>
            (s,&obj->nTransactions,&obj->vHash);
  local_40.bytes = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  SerializationOps<VectorWriter,_const_CPartialMerkleTree,_ActionSerialize>::anon_class_8_1_a7b7af8b
  ::operator()(&local_40,s,obj);
  Serialize<VectorWriter,unsigned_char,std::allocator<unsigned_char>>
            (s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SERIALIZE_METHODS(CPartialMerkleTree, obj)
    {
        READWRITE(obj.nTransactions, obj.vHash);
        std::vector<unsigned char> bytes;
        SER_WRITE(obj, bytes = BitsToBytes(obj.vBits));
        READWRITE(bytes);
        SER_READ(obj, obj.vBits = BytesToBits(bytes));
        SER_READ(obj, obj.fBad = false);
    }